

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_timer.cpp
# Opt level: O0

void __thiscall
period_cls::operator()
          (period_cls *this,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          t1,int a)

{
  bool bVar1;
  log_level lVar2;
  longlong lVar3;
  Logger *pLVar4;
  rep_conflict rVar5;
  duration<long,_std::ratio<1L,_1000000000L>_> local_88;
  duration<double,_std::ratio<1L,_1000L>_> local_80;
  int local_74;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_70;
  int tm_diff;
  time_point t2;
  longlong tid;
  int a_local;
  period_cls *this_local;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  t1_local;
  memory_order __b;
  
  this_local = (period_cls *)t1.__d.__r;
  t2.__d.__r = (duration)std::this_thread::get_id();
  lVar3 = tid_to_ll((id *)&t2);
  tStack_70.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_88.__r = (rep)std::chrono::operator-
                                (&stack0xffffffffffffff90,
                                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&this_local);
  std::chrono::duration<double,std::ratio<1l,1000l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1000l>> *)&local_80,&local_88);
  rVar5 = std::chrono::duration<double,_std::ratio<1L,_1000L>_>::count(&local_80);
  local_74 = (int)rVar5;
  pLVar4 = Logger::get_instance();
  bVar1 = Logger::is_inited(pLVar4);
  if ((!bVar1) && (-1 < pr_level)) {
    printf("[%-5s][%s:%d] logger must be inited before user!\n","error","operator()",0x27);
  }
  lVar2 = Logger::get_log_level();
  if (1 < (int)lVar2) {
    pLVar4 = Logger::get_instance();
    std::operator&(seq_cst,__memory_order_mask);
    Logger::write_log(pLVar4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/timer/tests/test_timer.cpp"
                      ,"operator()",0x27,LOG_LEVEL_INFO,
                      "[tid:%lld] hello, period_cls_func with param %d! period_cls_run_cnt = %d, time diff is %d ms\n"
                      ,lVar3,a,(this->period_cls_cnt).super___atomic_base<int>._M_i,local_74);
    pLVar4 = Logger::get_instance();
    Logger::flush(pLVar4);
  }
  LOCK();
  (this->period_cls_cnt).super___atomic_base<int>._M_i =
       (this->period_cls_cnt).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void operator()(chrono::time_point<chrono::steady_clock> t1, int a)
    {
        long long tid = tid_to_ll(this_thread::get_id());

        auto t2 = chrono::steady_clock::now();
        int tm_diff = static_cast<int>( chrono::duration<double, milli>(t2-t1).count() );
        LOG_INFO("[tid:%lld] hello, period_cls_func with param %d! period_cls_run_cnt = %d, time diff is %d ms\n", 
                                        tid, a, period_cls_cnt.load(), tm_diff);
        period_cls_cnt.fetch_add(1);
        return;
    }